

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

int conn_init(conn_handle *conn)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)conn->priv;
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)calloc(1,0x98);
    if (puVar2 == (undefined8 *)0x0) {
      return -0xc;
    }
    conn->priv = puVar2;
  }
  iVar1 = mutex_init((mutex_handle *)(puVar2 + 0x12));
  if (iVar1 < 0) {
    free(conn->priv);
    conn->priv = (void *)0x0;
  }
  else {
    *puVar2 = 0xffffffffffffffff;
    *(undefined4 *)(puVar2 + 1) = 0xffffffff;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int conn_init(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		conn->priv = priv;
	}

#ifdef _WIN32
	ret = WSAStartup(MAKEWORD(2, 2), &priv->wsadat);
	if (ret != 0) {
		ret = -ret;
		goto conn_init_exit_pre;
	}
#endif

	ret = mutex_init(&priv->mutex);
	if (ret < 0)
		goto conn_init_exit;

	priv->sock_fd = INVALID_SOCKET;
	priv->conn_fd = INVALID_SOCKET;
	priv->fd = INVALID_SOCKET;

	return 0;

conn_init_exit:
#ifdef _WIN32
	WSACleanup();
conn_init_exit_pre:
#endif
	free(conn->priv);
	conn->priv = NULL;

	return ret;
}